

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.cpp
# Opt level: O0

int OS_HttpClient::request
              (int opts,char *host,unsigned_short portno,char *verb,char *resource,
              char *send_headers,size_t send_headers_len,OS_HttpPayload *payload,
              CVmDataSource *reply,char **headers,char **location,char *ua)

{
  char *pcVar1;
  short *psVar2;
  int iVar3;
  char *pcVar4;
  OS_HttpPayloadItem *pOVar5;
  long lVar6;
  void *pvVar7;
  ushort in_DX;
  undefined8 in_RSI;
  uint in_EDI;
  undefined8 in_R8;
  short *in_R9;
  bool bVar8;
  ulong in_stack_00000008;
  OS_HttpPayload *in_stack_00000010;
  undefined8 in_stack_00000018;
  long *in_stack_00000020;
  undefined8 *in_stack_00000028;
  char *in_stack_00000030;
  size_t hlen;
  char *l;
  long http_stat;
  char *hn;
  char *h_1;
  size_t rem;
  char *p;
  CVmDataSource *stream_1;
  OS_HttpPayloadItem *item;
  int i;
  int cnt;
  CVmDataSource *stream;
  char *scheme;
  curl_slist *hdr_slist;
  CVmMemorySource *hstream;
  curl_httppost *formtail;
  curl_httppost *formhead;
  int ret;
  size_t formlen;
  char *formbuf;
  CURL *h;
  char *url;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  CVmMemorySource *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined8 local_e0;
  long local_d8;
  char *local_d0;
  short *local_c8;
  ulong local_c0;
  short *local_b8;
  CVmDataSource *local_b0;
  OS_HttpPayloadItem *local_a8;
  int local_a0;
  int local_9c;
  CVmDataSource *local_98;
  long local_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  int local_54;
  undefined8 local_50;
  char *local_48;
  long local_40;
  char *local_38;
  short *local_30;
  undefined8 local_28;
  ushort local_12;
  undefined8 local_10;
  
  local_38 = (char *)0x0;
  local_40 = 0;
  local_48 = (char *)0x0;
  local_50 = 0;
  local_54 = -100;
  local_60 = 0;
  local_68 = 0;
  local_70 = (long *)0x0;
  local_78 = 0;
  if (in_stack_00000028 != (undefined8 *)0x0) {
    *in_stack_00000028 = 0;
  }
  if (in_stack_00000020 != (long *)0x0) {
    *in_stack_00000020 = 0;
  }
  pcVar4 = "http";
  if ((in_EDI & 1) != 0) {
    pcVar4 = "https";
  }
  local_30 = in_R9;
  local_28 = in_R8;
  local_12 = in_DX;
  local_10 = in_RSI;
  local_40 = curl_easy_init();
  if (local_40 == 0) {
    local_54 = -100;
  }
  else {
    local_38 = t3sprintf_alloc("%s://%s:%d%s",pcVar4,local_10,(ulong)local_12,local_28);
    curl_easy_setopt(local_40,0x2712,local_38);
    curl_easy_setopt(local_40,0x2b,1);
    curl_easy_setopt(local_40,99,1);
    curl_easy_setopt(local_40,0x4e2b,http_get_recv);
    curl_easy_setopt(local_40,0x2711,in_stack_00000018);
    if (in_stack_00000020 != (long *)0x0) {
      local_70 = (long *)operator_new(0x10);
      CVmMemorySource::CVmMemorySource
                (in_stack_fffffffffffffec0,
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      curl_easy_setopt(local_40,0x4e6f,http_get_hdr);
      curl_easy_setopt(local_40,0x272d,local_70);
    }
    if ((in_stack_00000030 != (char *)0x0) && (*in_stack_00000030 != '\0')) {
      curl_easy_setopt(local_40,0x2722,in_stack_00000030);
    }
    iVar3 = stricmp(in_stack_fffffffffffffea0,
                    (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if (iVar3 != 0) {
      iVar3 = stricmp(in_stack_fffffffffffffea0,
                      (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if ((iVar3 == 0) && (in_stack_00000010 != (OS_HttpPayload *)0x0)) {
        iVar3 = OS_HttpPayload::count_items(in_stack_00000010);
        if ((iVar3 == 1) &&
           (pOVar5 = OS_HttpPayload::get(in_stack_00000010,0), *pOVar5->name == '\0')) {
          pOVar5 = OS_HttpPayload::get(in_stack_00000010,0);
          local_98 = pOVar5->stream;
          curl_easy_setopt(local_40,0x4e2c,http_get_send);
          curl_easy_setopt(local_40,0x2719,local_98);
          lVar6 = local_40;
          iVar3 = (*local_98->_vptr_CVmDataSource[6])();
          curl_easy_setopt(lVar6,0xe,iVar3);
        }
        else {
          iVar3 = OS_HttpPayload::is_multipart(in_stack_00000010);
          if (iVar3 == 0) {
            local_48 = OS_HttpPayload::urlencode
                                 ((OS_HttpPayload *)
                                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                  (size_t *)in_stack_fffffffffffffec0);
            curl_easy_setopt(local_40,0x2f,1);
            curl_easy_setopt(local_40,0x271f,local_48);
            curl_easy_setopt(local_40,0x3c,local_50);
          }
          else {
            local_9c = OS_HttpPayload::count_items(in_stack_00000010);
            for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
              local_a8 = OS_HttpPayload::get(in_stack_00000010,local_a0);
              if (local_a8->stream == (CVmDataSource *)0x0) {
                iVar3 = curl_formadd(&local_60,&local_68,1,local_a8->name,4,local_a8->val,0x11);
                if (iVar3 != 0) goto LAB_0024e0ef;
              }
              else {
                pcVar4 = local_a8->name;
                pcVar1 = local_a8->val;
                in_stack_fffffffffffffea0 = local_a8->mime_type;
                iVar3 = (*local_a8->stream->_vptr_CVmDataSource[6])();
                in_stack_fffffffffffffea8 = 6;
                iVar3 = curl_formadd(&local_60,&local_68,1,pcVar4,0x10,pcVar1,0xe,
                                     in_stack_fffffffffffffea0,6,iVar3,0x13,local_a8->stream,0x11);
                if (iVar3 != 0) goto LAB_0024e0ef;
                curl_easy_setopt(local_40,0x4e2c,http_get_send);
              }
            }
            curl_easy_setopt(local_40,0x2f,1);
            curl_easy_setopt(local_40,0x2728,local_60);
          }
        }
      }
      else {
        iVar3 = stricmp(in_stack_fffffffffffffea0,
                        (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        if ((iVar3 != 0) ||
           ((in_stack_00000010 == (OS_HttpPayload *)0x0 ||
            (iVar3 = OS_HttpPayload::count_items(in_stack_00000010), iVar3 != 1)))) {
          curl_easy_cleanup(local_40);
          return -4;
        }
        curl_easy_setopt(local_40,0x2e,1);
        pOVar5 = OS_HttpPayload::get(in_stack_00000010,0);
        local_b0 = pOVar5->stream;
        curl_easy_setopt(local_40,0x4e2c,http_get_send);
        curl_easy_setopt(local_40,0x2719,local_b0);
        lVar6 = local_40;
        iVar3 = (*local_b0->_vptr_CVmDataSource[6])();
        curl_easy_setopt(lVar6,0xe,iVar3);
      }
    }
    curl_easy_setopt(local_40,0x34,in_stack_00000028 == (undefined8 *)0x0);
    if (local_30 != (short *)0x0) {
      local_b8 = local_30;
      local_c0 = in_stack_00000008;
      while (local_c0 != 0) {
        while( true ) {
          bVar8 = false;
          if (((local_c0 != 0) && (bVar8 = false, (char)*local_b8 != '\r')) &&
             (bVar8 = false, (char)*local_b8 != '\n')) {
            iVar3 = is_space(L'\0');
            bVar8 = iVar3 != 0;
          }
          psVar2 = local_b8;
          if (!bVar8) break;
          local_b8 = (short *)((long)local_b8 + 1);
          local_c0 = local_c0 - 1;
        }
        local_c8 = local_b8;
        while( true ) {
          bVar8 = false;
          if (local_c0 != 0) {
            bVar8 = false;
            if (1 < local_c0) {
              bVar8 = *local_b8 == 0xa0d;
            }
            bVar8 = (bool)(bVar8 ^ 1);
          }
          if (!bVar8) break;
          local_b8 = (short *)((long)local_b8 + 1);
          local_c0 = local_c0 - 1;
        }
        if (local_b8 != psVar2) {
          local_d0 = lib_copy_str((char *)CONCAT44(in_stack_fffffffffffffeac,
                                                   in_stack_fffffffffffffea8),
                                  (size_t)in_stack_fffffffffffffea0);
          local_78 = curl_slist_append(local_78,local_d0);
          lib_free_str((char *)0x24df6a);
        }
        if (1 < local_c0) {
          local_b8 = local_b8 + 1;
          local_c0 = local_c0 - 2;
        }
      }
      curl_easy_setopt(local_40,0x2727,local_78);
    }
    iVar3 = curl_easy_perform(local_40);
    if (iVar3 == 0) {
      curl_easy_getinfo(local_40,0x200002,&local_d8);
      local_54 = (int)local_d8;
      if ((in_stack_00000028 != (undefined8 *)0x0) && (local_d8 == 0x12d)) {
        local_e0 = 0;
        curl_easy_getinfo(local_40,0x10001f,&local_e0);
        pcVar4 = lib_copy_str(in_stack_fffffffffffffea0);
        *in_stack_00000028 = pcVar4;
      }
      if (in_stack_00000020 != (long *)0x0) {
        lVar6 = (**(code **)(*local_70 + 0x30))();
        pvVar7 = operator_new__(lVar6 + 1);
        *in_stack_00000020 = (long)pvVar7;
        (**(code **)(*local_70 + 0x40))(local_70,0,0);
        (**(code **)(*local_70 + 0x10))(local_70,*in_stack_00000020,lVar6);
        *(undefined1 *)(*in_stack_00000020 + lVar6) = 0;
      }
    }
  }
LAB_0024e0ef:
  if (local_40 != 0) {
    curl_easy_cleanup(local_40);
  }
  if (local_38 != (char *)0x0) {
    lib_free_str((char *)0x24e11f);
  }
  if (local_48 != (char *)0x0) {
    free(local_48);
  }
  if (local_60 != 0) {
    curl_formfree(local_60);
  }
  if ((local_70 != (long *)0x0) && (local_70 != (long *)0x0)) {
    (**(code **)(*local_70 + 8))();
  }
  if (local_78 != 0) {
    curl_slist_free_all(local_78);
  }
  return local_54;
}

Assistant:

int OS_HttpClient::request(int opts,
                           const char *host, unsigned short portno,
                           const char *verb, const char *resource,
                           const char *send_headers, size_t send_headers_len,
                           OS_HttpPayload *payload,
                           CVmDataSource *reply, char **headers,
                           char **location, const char *ua)
{
    char *url = 0;                                     /* full resource URL */
    CURL *h = 0;                              /* libcurl transaction handle */
    char *formbuf = 0;          /* application/x-www-form-urlencoded buffer */
    size_t formlen = 0;                           /* length of formbuf data */
    int ret = ErrOther;                                      /* result code */
    curl_httppost *formhead = 0;          /* multipart form field list head */
    curl_httppost *formtail = 0;          /* multipart form field list tail */
    CVmMemorySource *hstream = 0;    /* memory stream for capturing headers */
    curl_slist *hdr_slist = 0;    /* caller's headers, in curl slist format */
    
    /* initially clear the location, if applicable */
    if (location != 0)
        *location = 0;

    /* presume no headers */
    if (headers != 0)
        *headers = 0;

    /* figure the scheme */
    const char *scheme = ((opts & OptHTTPS) != 0 ? "https" : "http");

    /* set up a handle for the communications */
    h = curl_easy_init();

    /* if that failed, return failure */
    if (h == 0)
    {
        ret = ErrOther;
        goto done;
    }

    /* build the full URL */
    url = t3sprintf_alloc("%s://%s:%d%s", scheme, host, portno, resource);

    /* set up the connection to the resource */
    curl_easy_setopt(h, CURLOPT_URL, url);

    /* we don't want a progress meter or signals */
    curl_easy_setopt(h, CURLOPT_NOPROGRESS, (long)1);
    curl_easy_setopt(h, CURLOPT_NOSIGNAL, (long)1);

    /* set our write callback */
    curl_easy_setopt(h, CURLOPT_WRITEFUNCTION, http_get_recv);
    curl_easy_setopt(h, CURLOPT_WRITEDATA, reply);

    /* set our header write callback, if the caller wants the headers */
    if (headers != 0)
    {
        hstream = new CVmMemorySource(1024);
        curl_easy_setopt(h, CURLOPT_HEADERFUNCTION, http_get_hdr);
        curl_easy_setopt(h, CURLOPT_WRITEHEADER, hstream);
    }

    /* if there's a user agent string, send it along */
    if (ua != 0 && ua[0] != '\0')
        curl_easy_setopt(h, CURLOPT_USERAGENT, ua);

    /* set the verb */
    if (stricmp(verb, "GET") == 0)
    {
        /* this is the default verb - no libcurl option setting is needed */
    }
    else if (stricmp(verb, "POST") == 0 && payload != 0)
    {
        /* check for a multipart/formdata upload */
        if (payload->count_items() == 1
            && payload->get(0)->name[0] == '\0')
        {
            /* 
             *   We have exactly one file-type item, and the item has an
             *   empty name.  In this case, the caller has pre-encoded the
             *   content body, so we don't want to apply any further POST
             *   encoding; simply use the content exactly as given. 
             */

            /* get the file to send - this is the payload item's stream */
            CVmDataSource *stream = payload->get(0)->stream;

            /* set up the source data */
            curl_easy_setopt(h, CURLOPT_READFUNCTION, http_get_send);
            curl_easy_setopt(h, CURLOPT_READDATA, stream);
            curl_easy_setopt(h, CURLOPT_INFILESIZE, stream->get_size());
        }
        else if (payload->is_multipart())
        {
            /* we have file attachments - build a curl_httppost list */
            int cnt = payload->count_items();
            for (int i = 0 ; i < cnt ; ++i)
            {
                /* get this item */
                OS_HttpPayloadItem *item = payload->get(i);

                /* check the item type */
                if (item->stream != 0)
                {
                    /* this is a file upload field */
                    if (curl_formadd(
                        &formhead, &formtail,
                        CURLFORM_COPYNAME, item->name,
                        CURLFORM_FILENAME, item->val,
                        CURLFORM_CONTENTTYPE, item->mime_type,
                        CURLFORM_CONTENTSLENGTH, item->stream->get_size(),
                        CURLFORM_STREAM, item->stream,
                        CURLFORM_END))
                        goto done;

                    /* make sure we've set the read callback */
                    curl_easy_setopt(h, CURLOPT_READFUNCTION, http_get_send);
                }
                else
                {
                    /* this is a simple name/value pair */
                    if (curl_formadd(&formhead, &formtail,
                                     CURLFORM_COPYNAME, item->name,
                                     CURLFORM_COPYCONTENTS, item->val,
                                     CURLFORM_END))
                        goto done;
                }
            }

            /* set up the post with the field list */
            curl_easy_setopt(h, CURLOPT_POST, (long)1);
            curl_easy_setopt(h, CURLOPT_HTTPPOST, formhead);
        }
        else
        {
            /* it's a simple form - build the urlencoded form data */
            formbuf = payload->urlencode(formlen);

            /* set the form data */
            curl_easy_setopt(h, CURLOPT_POST, (long)1);
            curl_easy_setopt(h, CURLOPT_POSTFIELDS, formbuf);
            curl_easy_setopt(h, CURLOPT_POSTFIELDSIZE, (long)formlen);
        }
    }
    else if (stricmp(verb, "PUT") == 0
             && payload != 0
             && payload->count_items() == 1)
    {
        /* set the PUT verb */
        curl_easy_setopt(h, CURLOPT_UPLOAD, (long)1);

        /* get the file to send - this is the single payload item's stream */
        CVmDataSource *stream = payload->get(0)->stream;

        /* set up the source data */
        curl_easy_setopt(h, CURLOPT_READFUNCTION, http_get_send);
        curl_easy_setopt(h, CURLOPT_READDATA, stream);
        curl_easy_setopt(h, CURLOPT_INFILESIZE, (long)stream->get_size());
    }
    else 
    {
        /* it's not GET, POST, or PUT - we don't accept other verbs */
        curl_easy_cleanup(h);
        return ErrParams;
    }

    /* 
     *   if a location parameter was provided, the caller wants to get any
     *   redirect location returned, rather than following the redirect;
     *   otherwise they want us to follow redirects 
     */
    curl_easy_setopt(h, CURLOPT_FOLLOWLOCATION, (long)(location == 0));

    /* add the caller's custom headers, if provided */
    if (send_headers != 0)
    {
        /* add each header to the list */
        const char *p = send_headers;
        size_t rem = send_headers_len;
        while (rem != 0)
        {
            /* skip leading spaces */
            for ( ; rem != 0 && *p != '\r' && *p != '\n' && is_space(*p) ;
                 ++p, --rem) ;

            /* scan to the CR-LF */
            const char *h = p;
            for ( ; rem != 0 && !(rem >= 2 && memcmp(p, "\r\n", 2) == 0) ;
                 ++p, --rem) ;

            /* if the line isn't empty, add the header */
            if (p != h)
            {
                /* get a null-terminated copy of the header */
                char *hn = lib_copy_str(h, p - h);

                /* add the header */
                hdr_slist = curl_slist_append(hdr_slist, hn);

                /* done with the copy of the string */
                lib_free_str(hn);
            }

            /* skip the CR-LF */
            if (rem >= 2)
                p += 2, rem -= 2;
        }

        /* set the header list in curl */
        curl_easy_setopt(h, CURLOPT_HTTPHEADER, hdr_slist);
    }

    /* 
     *   To debug problems with CURL, enable the next two lines, which tell
     *   CURL to call curl_debug() with detailed status information as it
     *   goes through the curl_easy_perform() call.  The status information
     *   can be very helpful in tracking down problems.  You can look at the
     *   status calls to curl_debug() using gdb or by modifying curl_debug()
     *   (see above) to write to a log file or the like.
     */
#ifdef OSNU_CURL_DEBUG
    curl_easy_setopt(h, CURLOPT_VERBOSE, 1);
    curl_easy_setopt(h, CURLOPT_DEBUGFUNCTION, curl_debug);
#endif

    /* do the transfer */
    if (!curl_easy_perform(h))
    {
        /* get the HTTP response code */
        long http_stat;
        curl_easy_getinfo(h, CURLINFO_RESPONSE_CODE, &http_stat);

        /* the HTTP response code is the return value */
        ret = (int)http_stat;

        /* if they wanted redirect data, and we got redirect data, return it */
        if (location != 0 && http_stat == 301)
        {
            char *l = 0;
            curl_easy_getinfo(h, CURLINFO_REDIRECT_URL, &l);
            
            /* copy it back to the caller */
            *location = lib_copy_str(l);
        }

        /* if they wanted headers, return the headers */
        if (headers != 0)
        {
            /* get the size of the headers */
            size_t hlen = hstream->get_size();

            /* allocate space for a copy for the caller (with null byte) */
            *headers = new char[hlen + 1];

            /* copy the headers into the new buffer */
            hstream->seek(0, OSFSK_SET);
            hstream->read(*headers, hlen);

            /* add the null terminator */
            (*headers)[hlen] = '\0';
        }
    }

done:
    /* close the handle */
    if (h != 0)
        curl_easy_cleanup(h);

    /* delete the URL buffer */
    if (url != 0)
        lib_free_str(url);

    /* free the form data buffer */
    if (formbuf != 0)
        t3free(formbuf);

    /* delete the multipart form field list */
    if (formhead != 0)
        curl_formfree(formhead);

    /* delete the header capture stream */
    if (hstream != 0)
        delete hstream;

    /* free the header slist */
    if (hdr_slist != 0)
        curl_slist_free_all(hdr_slist);

    /* return the result code */
    return ret;
}